

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void test_read_format_zip_ppmd8_crash_1(void)

{
  wchar_t wVar1;
  int iVar2;
  la_ssize_t v2;
  undefined1 local_68 [8];
  char buf [64];
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_31f63;
  extract_reference_file("test_read_format_zip_ppmd8_crash_2.zipx");
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'δ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_support_format_zip((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ε',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",ae);
  wVar1 = archive_read_open_filename((archive_conflict *)ae,(char *)a,100);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ζ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_open_filename(a, refname, 100)",ae);
  iVar2 = archive_read_next_header((archive *)ae,&local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'η',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
  v2 = archive_read_data((archive *)ae,local_68,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'μ',-0x1e,"ARCHIVE_FATAL",v2,"archive_read_data(a, buf, 1)",ae);
  iVar2 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ν',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",ae);
  iVar2 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ξ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",ae);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_ppmd8_crash_1)
{
	const char *refname = "test_read_format_zip_ppmd8_crash_2.zipx";
	struct archive *a;
	struct archive_entry *ae;
	char buf[64];

	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 100));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

	/* This file shouldn't be properly decompressed, because it's invalid.
	 * However, unpacker should return an error during unpacking. Without the
	 * proper fix, the unpacker was entering an unlimited loop. */
	assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data(a, buf, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}